

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshrec.c
# Opt level: O2

void ps_hints_t1stem3(PS_Hints hints,FT_UInt dimension,FT_Fixed *stems)

{
  FT_Memory memory;
  FT_Error FVar1;
  FT_Int FVar2;
  FT_Fixed FVar3;
  FT_Fixed FVar4;
  PS_Mask pPVar5;
  long lVar6;
  PS_Hints pPVar7;
  PS_Mask pPVar8;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  FT_UInt local_54 [2];
  FT_Int idx [3];
  PS_Mask local_40;
  FT_UInt local_38;
  FT_UInt local_34;
  
  if (hints->error != 0) {
    return;
  }
  bVar11 = dimension != 0;
  if (hints->hint_type != PS_HINT_TYPE_1) {
    FVar1 = 6;
    pPVar7 = hints;
    goto LAB_0020f73f;
  }
  memory = hints->memory;
  idx._4_8_ = hints;
  for (lVar6 = 0; pPVar7 = (PS_Hints)idx._4_8_, lVar6 != 0xc; lVar6 = lVar6 + 4) {
    FVar3 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar6 * 4));
    FVar4 = FT_RoundFix(*(FT_Fixed *)((long)stems + lVar6 * 4 + 8));
    FVar1 = ps_dimension_add_t1stem
                      (hints->dimension + bVar11,(FT_Int)((ulong)FVar3 >> 0x10),
                       (FT_Int)((ulong)FVar4 >> 0x10),memory,(FT_Int *)((long)local_54 + lVar6));
    pPVar7 = (PS_Hints)idx._4_8_;
    if (FVar1 != 0) goto LAB_0020f73f;
  }
  local_38 = local_54[1];
  local_34 = idx[0];
  uVar10 = (ulong)hints->dimension[bVar11].counters.num_masks;
  pPVar8 = hints->dimension[bVar11].counters.masks;
  pPVar5 = pPVar8 + uVar10;
  while (iVar9 = (int)uVar10, uVar10 = (ulong)(iVar9 - 1), iVar9 != 0) {
    FVar2 = ps_mask_test_bit(pPVar8,local_54[0]);
    local_40 = pPVar8;
    if (((FVar2 != 0) || (FVar2 = ps_mask_test_bit(pPVar8,local_38), FVar2 != 0)) ||
       (FVar2 = ps_mask_test_bit(pPVar8,local_34), FVar2 != 0)) goto LAB_0020f6c7;
    pPVar8 = pPVar8 + 1;
  }
  local_40 = pPVar5;
  FVar1 = ps_mask_table_alloc(&hints->dimension[bVar11].counters,memory,&local_40);
  if (FVar1 != 0) goto LAB_0020f73f;
LAB_0020f6c7:
  if ((-1 < (int)local_54[0]) && (FVar1 = ps_mask_set_bit(local_40,local_54[0],memory), FVar1 != 0))
  goto LAB_0020f73f;
  pPVar8 = local_40;
  if ((int)local_38 < 0) {
    if ((int)local_34 < 0) {
      return;
    }
LAB_0020f730:
    FVar1 = ps_mask_set_bit(pPVar8,local_34,memory);
  }
  else {
    FVar1 = ps_mask_set_bit(local_40,local_38,memory);
    if (-1 < (int)local_34 && FVar1 == 0) goto LAB_0020f730;
  }
  if (FVar1 == 0) {
    return;
  }
LAB_0020f73f:
  pPVar7->error = FVar1;
  return;
}

Assistant:

static void
  ps_hints_t1stem3( PS_Hints   hints,
                    FT_UInt    dimension,
                    FT_Fixed*  stems )
  {
    FT_Error  error = FT_Err_Ok;


    if ( !hints->error )
    {
      PS_Dimension  dim;
      FT_Memory     memory = hints->memory;
      FT_Int        count;
      FT_Int        idx[3];


      /* limit "dimension" to 0..1 */
      if ( dimension > 1 )
      {
        FT_TRACE0(( "ps_hints_t1stem3: invalid dimension (%d) used\n",
                    dimension ));
        dimension = ( dimension != 0 );
      }

      dim = &hints->dimension[dimension];

      /* there must be 6 elements in the 'stem' array */
      if ( hints->hint_type == PS_HINT_TYPE_1 )
      {
        /* add the three stems to our hints/masks table */
        for ( count = 0; count < 3; count++, stems += 2 )
        {
          error = ps_dimension_add_t1stem( dim,
                                           (FT_Int)FIXED_TO_INT( stems[0] ),
                                           (FT_Int)FIXED_TO_INT( stems[1] ),
                                           memory, &idx[count] );
          if ( error )
            goto Fail;
        }

        /* now, add the hints to the counters table */
        error = ps_dimension_add_counter( dim, idx[0], idx[1], idx[2],
                                          memory );
        if ( error )
          goto Fail;
      }
      else
      {
        FT_ERROR(( "ps_hints_t1stem3: called with invalid hint type\n" ));
        error = FT_THROW( Invalid_Argument );
        goto Fail;
      }
    }

    return;

  Fail:
    FT_ERROR(( "ps_hints_t1stem3: could not add counter stems to table\n" ));
    hints->error = error;
  }